

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

void __thiscall script_tests::sign_paytoanchor::test_method(sign_paytoanchor *this)

{
  _Base_ptr p_Var1;
  bool bVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  CMutableTransaction curr;
  CMutableTransaction prev;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  check_type cVar3;
  char *local_5c8;
  char *local_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  PayToAnchor local_588;
  CMutableTransaction local_568;
  undefined1 local_530 [56];
  undefined1 local_4f8 [72];
  __index_type local_4b0;
  undefined1 local_470 [24];
  undefined8 uStack_458;
  SignatureData local_450;
  SigningProvider local_c0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_b8;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_88;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_c0._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bce20;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50 = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_58 = 0;
  local_40 = 0;
  uStack_38 = 0;
  uStack_48 = 1;
  local_450.complete = false;
  local_450.witness = false;
  p_Var1 = &local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&local_450.scriptSig,0,0xb8);
  local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_450.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_450.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_450.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_450.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_450.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_450.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  local_450.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
  local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_450.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_530);
  CMutableTransaction::CMutableTransaction(&local_568);
  local_5b8 = (char *)((ulong)local_5b8._4_4_ << 0x20);
  PayToAnchor::PayToAnchor(&local_588);
  local_4f8._0_4_ = local_588.super_WitnessUnknown.m_version;
  local_4f8._8_8_ =
       local_588.super_WitnessUnknown.m_program.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_4f8._16_8_ =
       local_588.super_WitnessUnknown.m_program.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_4f8._24_8_ =
       local_588.super_WitnessUnknown.m_program.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_588.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_588.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_588.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4b0 = '\a';
  GetScriptForDestination((CScript *)local_470,(CTxDestination *)local_4f8);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)(local_530 + 0x18),(int *)&local_5b8,
             (CScript *)local_470);
  if (0x1c < uStack_458._4_4_) {
    free((void *)local_470._0_8_);
    local_470._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_4f8);
  if ((element_type *)
      local_588.super_WitnessUnknown.m_program.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_588.super_WitnessUnknown.m_program.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_588.super_WitnessUnknown.m_program.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.super_WitnessUnknown.m_program.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  CMutableTransaction::GetHash((Txid *)local_470,(CMutableTransaction *)local_530);
  local_4f8._16_8_ = local_470._16_8_;
  local_4f8._24_8_ = uStack_458;
  local_4f8._0_8_ = local_470._0_8_;
  local_4f8._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&local_568.vin,(COutPoint *)local_4f8);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x50e;
  file.m_begin = (iterator)&local_598;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5a8,msg);
  CTransaction::CTransaction((CTransaction *)local_4f8,(CMutableTransaction *)local_530);
  bVar2 = SignSignature(&local_c0,(CTransaction *)local_4f8,&local_568,0,1,&local_450);
  local_588.super_WitnessUnknown.m_version =
       CONCAT31(local_588.super_WitnessUnknown.m_version._1_3_,bVar2);
  local_588.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_588.super_WitnessUnknown.m_program.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5b8 = "SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data)";
  local_5b0 = "";
  local_470[8] = '\0';
  local_470._0_8_ = &PTR__lazy_ostream_013abc70;
  local_470._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5c0 = "";
  uStack_458 = (int *)&local_5b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_588,(lazy_ostream *)local_470,1,0,WARN,_cVar3,
             (size_t)&local_5c8,0x50e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_588.super_WitnessUnknown.m_program.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_4f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_4f8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_568.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_568.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_530 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_530);
  SignatureData::~SignatureData(&local_450);
  local_c0._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bce20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_88);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_paytoanchor)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;
    prev.vout.emplace_back(0, GetScriptForDestination(PayToAnchor{}));

    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});

    BOOST_CHECK(SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}